

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_67::BinaryReaderIR::SetBlockDeclaration
          (BinaryReaderIR *this,BlockDeclaration *decl,Type sig_type)

{
  pointer pTVar1;
  Var local_a8;
  Location local_58;
  allocator_type local_29;
  
  if (sig_type < Any) {
    decl->has_func_type = false;
    pTVar1 = (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_finish != pTVar1) {
      (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = pTVar1;
    }
    local_58.filename.data_ = (char *)CONCAT44(local_58.filename.data_._4_4_,sig_type);
    if (sig_type == Void) {
      local_a8.loc.filename.data_ = (char *)0x0;
      local_a8.loc.filename.size_ = 0;
      local_a8.loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
    }
    else {
      std::vector<wabt::Type,std::allocator<wabt::Type>>::vector<wabt::Type*,void>
                ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_a8,(Type *)&local_58,
                 (Type *)((long)&local_58.filename.data_ + 4),&local_29);
    }
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::_M_move_assign
              (&(decl->sig).result_types,&local_a8);
    std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
              ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)&local_a8);
  }
  else {
    decl->has_func_type = true;
    local_58.field_1.field_0.line = 0;
    local_58.field_1._4_8_ = 0;
    local_58.filename.data_ = (char *)0x0;
    local_58.filename.size_._0_4_ = 0;
    local_58.filename.size_._4_4_ = 0;
    Var::Var(&local_a8,sig_type,&local_58);
    Var::operator=(&decl->type_var,&local_a8);
    Var::~Var(&local_a8);
    FuncSignature::operator=
              (&decl->sig,
               &(this->module_->func_types).
                super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>._M_impl.
                super__Vector_impl_data._M_start[(uint)sig_type]->sig);
  }
  return;
}

Assistant:

void BinaryReaderIR::SetBlockDeclaration(BlockDeclaration* decl,
                                         Type sig_type) {
  if (IsTypeIndex(sig_type)) {
    Index type_index = GetTypeIndex(sig_type);
    decl->has_func_type = true;
    decl->type_var = Var(type_index);
    decl->sig = module_->func_types[type_index]->sig;
  } else {
    decl->has_func_type = false;
    decl->sig.param_types.clear();
    decl->sig.result_types = GetInlineTypeVector(sig_type);
  }
}